

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_diag_sse2_128_64.c
# Opt level: O3

parasail_result_t *
parasail_nw_stats_rowcol_diag_sse2_128_64
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  ulong uVar1;
  int *piVar2;
  ulong uVar3;
  ulong uVar4;
  long *plVar5;
  void *pvVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  uint uVar14;
  parasail_result_t *ppVar15;
  int64_t *ptr;
  int64_t *ptr_00;
  int64_t *ptr_01;
  int64_t *ptr_02;
  int64_t *ptr_03;
  int64_t *ptr_04;
  int64_t *ptr_05;
  int64_t *ptr_06;
  int64_t *ptr_07;
  int64_t *ptr_08;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  int iVar33;
  long lVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  long lVar46;
  __m128i_64_t A;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  int iVar56;
  int iVar67;
  long lVar57;
  long lVar58;
  int iVar68;
  undefined1 auVar59 [16];
  int iVar70;
  long lVar69;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  int iVar71;
  int iVar72;
  int iVar82;
  int iVar83;
  __m128i_64_t A_5;
  undefined1 auVar73 [16];
  int iVar84;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  uint uVar85;
  int iVar89;
  __m128i_64_t A_7;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  int iVar96;
  __m128i_64_t B_1;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  __m128i_64_t A_4;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  __m128i_64_t A_10;
  long lVar104;
  __m128i_64_t A_2;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  __m128i_64_t A_6;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  __m128i_64_t A_1;
  int64_t iVar114;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  int iVar119;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  int iVar120;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  __m128i_64_t A_3;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  __m128i_64_t B_5;
  int local_318;
  int iStack_314;
  uint local_30c;
  uint local_2e0;
  long local_298;
  long lStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  int64_t local_278;
  undefined8 uStack_270;
  uint local_260;
  int iStack_25c;
  undefined1 local_218 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_178 [16];
  long local_168;
  long lStack_160;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  ulong uStack_110;
  long local_f8;
  long lStack_f0;
  ulong uStack_e0;
  
  if (_s2 == (char *)0x0) {
    parasail_nw_stats_rowcol_diag_sse2_128_64_cold_8();
    return (parasail_result_t *)0x0;
  }
  if (s2Len < 1) {
    parasail_nw_stats_rowcol_diag_sse2_128_64_cold_7();
    return (parasail_result_t *)0x0;
  }
  if (open < 0) {
    parasail_nw_stats_rowcol_diag_sse2_128_64_cold_6();
    return (parasail_result_t *)0x0;
  }
  uVar24 = (ulong)(uint)gap;
  if (gap < 0) {
    parasail_nw_stats_rowcol_diag_sse2_128_64_cold_5();
    return (parasail_result_t *)0x0;
  }
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_nw_stats_rowcol_diag_sse2_128_64_cold_4();
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 1) {
    if (_s1 == (char *)0x0) {
      parasail_nw_stats_rowcol_diag_sse2_128_64_cold_3();
      return (parasail_result_t *)0x0;
    }
  }
  else {
    if (_s1 == (char *)0x0) {
      parasail_nw_stats_rowcol_diag_sse2_128_64_cold_2();
      return (parasail_result_t *)0x0;
    }
    if (_s1Len < 1) {
      parasail_nw_stats_rowcol_diag_sse2_128_64_cold_1();
      return (parasail_result_t *)0x0;
    }
    if (matrix->type == 0) goto LAB_00630d33;
  }
  _s1Len = matrix->length;
LAB_00630d33:
  iVar89 = matrix->min;
  iVar33 = -open;
  uVar27 = 0x8000000000000000 - (long)iVar89;
  if (iVar89 != iVar33 && SBORROW4(iVar89,iVar33) == iVar89 + open < 0) {
    uVar27 = (ulong)(uint)open | 0x8000000000000000;
  }
  iVar89 = matrix->max;
  ppVar15 = parasail_result_new_rowcol3(_s1Len,s2Len);
  if (ppVar15 != (parasail_result_t *)0x0) {
    ppVar15->flag = ppVar15->flag | 0x2851001;
    ptr = parasail_memalign_int64_t(0x10,(long)(_s1Len + 1));
    uVar19 = (ulong)(s2Len + 2);
    ptr_00 = parasail_memalign_int64_t(0x10,uVar19);
    ptr_01 = parasail_memalign_int64_t(0x10,uVar19);
    ptr_02 = parasail_memalign_int64_t(0x10,uVar19);
    ptr_03 = parasail_memalign_int64_t(0x10,uVar19);
    ptr_04 = parasail_memalign_int64_t(0x10,uVar19);
    ptr_05 = parasail_memalign_int64_t(0x10,uVar19);
    ptr_06 = parasail_memalign_int64_t(0x10,uVar19);
    ptr_07 = parasail_memalign_int64_t(0x10,uVar19);
    ptr_08 = parasail_memalign_int64_t(0x10,uVar19);
    auVar40._0_4_ = -(uint)((int)ptr == 0);
    auVar40._4_4_ = -(uint)((int)((ulong)ptr >> 0x20) == 0);
    auVar40._8_4_ = -(uint)((int)ptr_00 == 0);
    auVar40._12_4_ = -(uint)((int)((ulong)ptr_00 >> 0x20) == 0);
    auVar86._4_4_ = auVar40._0_4_;
    auVar86._0_4_ = auVar40._4_4_;
    auVar86._8_4_ = auVar40._12_4_;
    auVar86._12_4_ = auVar40._8_4_;
    auVar122._0_4_ = -(uint)((int)ptr_01 == 0);
    auVar122._4_4_ = -(uint)((int)((ulong)ptr_01 >> 0x20) == 0);
    auVar122._8_4_ = -(uint)((int)ptr_02 == 0);
    auVar122._12_4_ = -(uint)((int)((ulong)ptr_02 >> 0x20) == 0);
    auVar90._4_4_ = auVar122._0_4_;
    auVar90._0_4_ = auVar122._4_4_;
    auVar90._8_4_ = auVar122._12_4_;
    auVar90._12_4_ = auVar122._8_4_;
    auVar90 = packssdw(auVar86 & auVar40,auVar90 & auVar122);
    auVar123._0_4_ = -(uint)((int)ptr_03 == 0);
    auVar123._4_4_ = -(uint)((int)((ulong)ptr_03 >> 0x20) == 0);
    auVar123._8_4_ = -(uint)((int)ptr_04 == 0);
    auVar123._12_4_ = -(uint)((int)((ulong)ptr_04 >> 0x20) == 0);
    auVar106._4_4_ = auVar123._0_4_;
    auVar106._0_4_ = auVar123._4_4_;
    auVar106._8_4_ = auVar123._12_4_;
    auVar106._12_4_ = auVar123._8_4_;
    auVar121._0_4_ = -(uint)((int)ptr_05 == 0);
    auVar121._4_4_ = -(uint)((int)((ulong)ptr_05 >> 0x20) == 0);
    auVar121._8_4_ = -(uint)((int)ptr_06 == 0);
    auVar121._12_4_ = -(uint)((int)((ulong)ptr_06 >> 0x20) == 0);
    auVar73._4_4_ = auVar121._0_4_;
    auVar73._0_4_ = auVar121._4_4_;
    auVar73._8_4_ = auVar121._12_4_;
    auVar73._12_4_ = auVar121._8_4_;
    auVar40 = packssdw(auVar106 & auVar123,auVar73 & auVar121);
    auVar40 = packssdw(auVar90,auVar40);
    if ((ptr_08 != (int64_t *)0x0 && ptr_07 != (int64_t *)0x0) &&
        ((((((((auVar40 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
              (auVar40 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar40 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar40 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar40 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar40 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar40 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar40[0xf]))
    {
      uVar19 = uVar27 + 1;
      lVar16 = 0x7ffffffffffffffe - (long)iVar89;
      lVar29 = (long)_s1Len;
      uVar17 = (ulong)(uint)s2Len;
      lVar20 = (long)iVar33;
      local_298 = (long)(iVar33 - gap);
      if (0 < _s1Len) {
        piVar2 = matrix->mapper;
        lVar21 = 0;
        do {
          ptr[lVar21] = (long)piVar2[(byte)_s1[lVar21]];
          lVar21 = lVar21 + 1;
        } while (lVar29 != lVar21);
      }
      local_2e0 = _s1Len - 1;
      local_30c = s2Len - 1;
      auVar91._8_4_ = (int)uVar19;
      auVar91._0_8_ = uVar19;
      auVar91._12_4_ = (int)(uVar19 >> 0x20);
      uVar85 = (uint)lVar16;
      iVar89 = (int)((ulong)lVar16 >> 0x20);
      local_1c8._8_4_ = uVar85;
      local_1c8._0_8_ = lVar16;
      local_1c8._12_4_ = iVar89;
      ptr[lVar29] = 0;
      piVar2 = matrix->mapper;
      uVar25 = 0;
      do {
        ptr_00[uVar25 + 1] = (long)piVar2[(byte)_s2[uVar25]];
        uVar25 = uVar25 + 1;
      } while (uVar17 != uVar25);
      *ptr_00 = 0;
      ptr_00[uVar17 + 1] = 0;
      uVar25 = 0;
      lVar16 = lVar20;
      do {
        ptr_01[uVar25 + 1] = lVar16;
        ptr_02[uVar25 + 1] = 0;
        ptr_03[uVar25 + 1] = 0;
        ptr_04[uVar25 + 1] = 0;
        ptr_05[uVar25 + 1] = uVar19;
        ptr_06[uVar25 + 1] = 0;
        ptr_07[uVar25 + 1] = 0;
        ptr_08[uVar25 + 1] = 0;
        uVar25 = uVar25 + 1;
        lVar16 = lVar16 - uVar24;
      } while (uVar17 != uVar25);
      *ptr_02 = 0;
      *ptr_03 = 0;
      *ptr_04 = 0;
      *ptr_05 = 0;
      *ptr_06 = 0;
      *ptr_07 = 0;
      *ptr_08 = 0;
      ptr_01[uVar17 + 1] = 0;
      ptr_02[uVar17 + 1] = 0;
      ptr_03[uVar17 + 1] = 0;
      ptr_04[uVar17 + 1] = 0;
      ptr_05[uVar17 + 1] = 0;
      ptr_06[uVar17 + 1] = 0;
      ptr_07[uVar17 + 1] = 0;
      ptr_08[uVar17 + 1] = 0;
      *ptr_01 = 0;
      auVar40 = auVar91;
      auVar90 = auVar91;
      auVar106 = auVar91;
      auVar122 = auVar91;
      local_218 = auVar91;
      if (0 < _s1Len) {
        piVar2 = matrix->matrix;
        uVar18 = (ulong)local_30c;
        local_318 = (int)(lVar29 + -1);
        iStack_314 = (int)((ulong)(lVar29 + -1) >> 0x20);
        auVar59 = ZEXT416(1);
        uVar25 = 0;
        lStack_290 = lVar20;
        do {
          uVar3 = ptr[uVar25];
          lVar16 = ptr[uVar25 + 1];
          uVar22 = uVar25 | 1;
          uVar14 = local_2e0;
          if ((long)uVar22 < lVar29) {
            uVar14 = (uint)uVar25 | 1;
          }
          bVar35 = matrix->type == 0;
          iVar33 = matrix->size;
          uVar26 = uVar25;
          if (bVar35) {
            uVar26 = uVar3;
          }
          lVar21 = (long)(int)uVar14;
          if (bVar35) {
            lVar21 = lVar16;
          }
          uVar1 = uVar25 + 2;
          iVar114 = *ptr_01;
          *ptr_01 = lVar20 - uVar1 * uVar24;
          auVar111._8_8_ = 0;
          auVar111._0_8_ = lVar20 - uVar25 * uVar24;
          auVar111 = auVar111 << 0x40;
          lVar46 = 0;
          iVar56 = -(uint)(auVar59._0_4_ == local_318);
          iVar67 = -(uint)(auVar59._4_4_ == iStack_314);
          iVar68 = -(uint)(auVar59._8_4_ == local_318);
          iVar70 = -(uint)(auVar59._12_4_ == iStack_314);
          uVar23 = 0;
          local_168 = -1;
          lStack_160 = 0;
          auVar102 = (undefined1  [16])0x0;
          local_288 = 0;
          uStack_280 = 0;
          uStack_270 = 0;
          auVar48._8_8_ = 0;
          auVar48._0_8_ = uVar19;
          auVar48 = auVar48 << 0x40;
          auVar43 = ZEXT816(0);
          auVar73 = (undefined1  [16])0x0;
          local_1f8 = (undefined1  [16])0x0;
          auVar121 = ZEXT816(0);
          auVar123 = (undefined1  [16])0x0;
          local_178 = (undefined1  [16])0x0;
          local_1e8 = (undefined1  [16])0x0;
          local_158 = (undefined1  [16])0x0;
          local_148 = (undefined1  [16])0x0;
          auVar61 = auVar91;
          local_1d8 = auVar48;
          do {
            uVar4 = ptr_00[uVar23 + 1];
            iVar72 = piVar2[uVar26 * (long)iVar33 + uVar4];
            iVar96 = piVar2[lVar21 * iVar33 + ptr_00[uVar23]];
            lVar57 = iVar96 + lVar46;
            lVar69 = iVar72 + iVar114;
            lVar46 = auVar111._8_8_;
            iVar114 = ptr_01[uVar23 + 1];
            auVar105._0_8_ = lVar46 - (ulong)(uint)open;
            auVar105._8_8_ = iVar114 - (ulong)(uint)open;
            uStack_e0 = (ulong)(uint)gap;
            auVar110._0_8_ = CONCAT44(local_1d8._4_4_,local_1d8._8_4_) - uVar24;
            auVar110._8_8_ = ptr_05[uVar23 + 1] - uStack_e0;
            auVar86 = auVar110 ^ _DAT_00904920;
            auVar115 = auVar105 ^ _DAT_00904920;
            iVar71 = -(uint)(auVar86._0_4_ < auVar115._0_4_);
            iVar82 = -(uint)(auVar86._4_4_ < auVar115._4_4_);
            iVar83 = -(uint)(auVar86._8_4_ < auVar115._8_4_);
            iVar84 = -(uint)(auVar86._12_4_ < auVar115._12_4_);
            auVar116._4_4_ = -(uint)(auVar115._4_4_ == auVar86._4_4_);
            auVar116._12_4_ = -(uint)(auVar115._12_4_ == auVar86._12_4_);
            auVar116._0_4_ = auVar116._4_4_;
            auVar116._8_4_ = auVar116._12_4_;
            auVar87._4_4_ = iVar71;
            auVar87._0_4_ = iVar71;
            auVar87._8_4_ = iVar83;
            auVar87._12_4_ = iVar83;
            auVar88._0_8_ = auVar102._8_8_;
            auVar115._4_4_ = iVar82;
            auVar115._0_4_ = iVar82;
            auVar115._8_4_ = iVar84;
            auVar115._12_4_ = iVar84;
            auVar115 = auVar115 | auVar116 & auVar87;
            local_1d8 = auVar105 & auVar115 | ~auVar115 & auVar110;
            auVar107._0_8_ = auVar111._0_8_ - (ulong)(uint)open;
            auVar107._8_8_ = lVar46 - (ulong)(uint)open;
            auVar92._0_8_ = auVar48._0_8_ - uVar24;
            auVar92._8_8_ = auVar48._8_8_ - uStack_e0;
            auVar86 = auVar92 ^ _DAT_00904920;
            auVar111 = auVar107 ^ _DAT_00904920;
            iVar83 = -(uint)(auVar86._0_4_ < auVar111._0_4_);
            iVar84 = -(uint)(auVar86._4_4_ < auVar111._4_4_);
            iVar119 = -(uint)(auVar86._8_4_ < auVar111._8_4_);
            iVar120 = -(uint)(auVar86._12_4_ < auVar111._12_4_);
            iVar71 = -(uint)(auVar111._4_4_ == auVar86._4_4_);
            iVar82 = -(uint)(auVar111._12_4_ == auVar86._12_4_);
            auVar109._4_4_ = iVar71;
            auVar109._0_4_ = iVar71;
            auVar109._8_4_ = iVar82;
            auVar109._12_4_ = iVar82;
            auVar112._4_4_ = iVar83;
            auVar112._0_4_ = iVar83;
            auVar112._8_4_ = iVar119;
            auVar112._12_4_ = iVar119;
            auVar113._4_4_ = iVar84;
            auVar113._0_4_ = iVar84;
            auVar113._8_4_ = iVar120;
            auVar113._12_4_ = iVar120;
            auVar113 = auVar113 | auVar109 & auVar112;
            auVar86 = auVar107 & auVar113 | ~auVar113 & auVar92;
            lVar31 = auVar86._0_8_;
            if (auVar86._0_8_ < lVar57) {
              lVar31 = lVar57;
            }
            lVar58 = local_1d8._8_8_;
            lVar28 = auVar86._8_8_;
            if (auVar86._8_8_ < lVar69) {
              lVar28 = lVar69;
            }
            lVar104 = auVar61._8_8_;
            lVar34 = local_1d8._0_8_;
            lVar32 = lVar34;
            if (lVar34 < lVar31) {
              lVar32 = lVar31;
            }
            lVar30 = lVar58;
            if (lVar58 < lVar28) {
              lVar30 = lVar28;
            }
            auVar93._0_8_ = (ulong)(lVar16 == lVar104) + local_148._0_8_;
            auVar93._8_8_ = (ulong)(uVar3 == uVar4) + local_148._8_8_;
            local_148._0_8_ = local_178._8_8_;
            local_148._8_8_ = ptr_02[uVar23 + 1];
            auVar117._0_4_ = -(uint)(0 < iVar96);
            auVar117._4_4_ = 0;
            auVar117._8_4_ = -(uint)(0 < iVar72);
            auVar117._12_4_ = 0;
            auVar118._0_8_ = SUB168(auVar117 & _DAT_009050f0,0) + local_158._0_8_;
            auVar118._8_8_ = SUB168(auVar117 & _DAT_009050f0,8) + local_158._8_8_;
            local_158._0_8_ = auVar73._8_8_;
            local_158._8_8_ = ptr_03[uVar23 + 1];
            auVar97._0_8_ = auVar123._8_8_;
            auVar97._8_8_ = ptr_04[uVar23 + 1];
            auVar74._8_8_ = ptr_06[uVar23 + 1];
            auVar74._0_8_ = uStack_270;
            local_288._4_4_ = (undefined4)((ulong)local_288 >> 0x20);
            auVar108._4_4_ = local_288._4_4_;
            auVar108._0_4_ = (undefined4)uStack_280;
            auVar108._8_8_ = ptr_07[uVar23 + 1];
            auVar88._8_8_ = ptr_08[uVar23 + 1];
            auVar105 = local_148 & auVar115 | ~auVar115 & auVar74;
            auVar109 = local_158 & auVar115 | ~auVar115 & auVar108;
            auVar111 = ~auVar115 & auVar88 | auVar97 & auVar115;
            auVar121 = local_178 & auVar113 | ~auVar113 & auVar121;
            local_1f8 = auVar73 & auVar113 | ~auVar113 & local_1f8;
            auVar73 = ~auVar113 & auVar43 | auVar123 & auVar113;
            auVar47._8_8_ = lVar30;
            auVar47._0_8_ = lVar32;
            auVar41._8_8_ = -(ulong)(lVar30 == lVar69);
            auVar41._0_8_ = -(ulong)(lVar32 == lVar57);
            auVar75._8_8_ = -(ulong)(lVar28 <= lVar58);
            auVar75._0_8_ = -(ulong)(lVar31 <= lVar34);
            auVar98._8_4_ = 0xffffffff;
            auVar98._0_8_ = 0xffffffffffffffff;
            auVar98._12_4_ = 0xffffffff;
            auVar102._0_8_ = auVar111._0_8_ + 1;
            auVar102._8_8_ = auVar111._8_8_ - auVar98._8_8_;
            auVar43._0_8_ = auVar73._0_8_ + 1;
            auVar43._8_8_ = auVar73._8_8_ - auVar98._8_8_;
            auVar103._8_4_ = 0xffffffff;
            auVar103._0_8_ = 0xffffffffffffffff;
            auVar103._12_4_ = 0xffffffff;
            auVar60._0_8_ = local_1e8._0_8_ + 1;
            auVar60._8_8_ = local_1e8._8_8_ - auVar103._8_8_;
            auVar76._0_4_ = -(uint)((int)local_168 == -1);
            auVar76._4_4_ = -(uint)((int)((ulong)local_168 >> 0x20) == -1);
            auVar76._8_4_ = -(uint)((int)lStack_160 == -1);
            auVar76._12_4_ = -(uint)((int)((ulong)lStack_160 >> 0x20) == -1);
            auVar42._4_4_ = auVar76._0_4_;
            auVar42._0_4_ = auVar76._4_4_;
            auVar42._8_4_ = auVar76._12_4_;
            auVar42._12_4_ = auVar76._8_4_;
            auVar42 = auVar42 & auVar76;
            auVar12._8_8_ = lStack_290;
            auVar12._0_8_ = local_298;
            auVar111 = auVar12 & auVar42 | ~auVar42 & auVar47;
            local_178 = ~auVar42 &
                        (auVar93 & auVar41 | ~auVar41 & (auVar75 & auVar105 | ~auVar75 & auVar121));
            auVar73 = ~auVar42 &
                      (auVar118 & auVar41 | ~auVar41 & (auVar75 & auVar109 | ~auVar75 & local_1f8));
            auVar123 = ~auVar42 &
                       (auVar60 & auVar41 | ~auVar41 & (auVar75 & auVar102 | ~auVar75 & auVar43));
            if (1 < uVar23) {
              auVar48 = local_1c8 ^ _DAT_00904920;
              auVar61 = auVar111 ^ _DAT_00904920;
              iVar72 = -(uint)(auVar48._0_4_ < auVar61._0_4_);
              iVar96 = auVar61._4_4_;
              auVar77._4_4_ = -(uint)(auVar48._4_4_ < iVar96);
              iVar83 = auVar61._12_4_;
              iVar71 = -(uint)(auVar48._8_4_ < auVar61._8_4_);
              auVar77._12_4_ = -(uint)(auVar48._12_4_ < iVar83);
              auVar94._4_4_ = iVar72;
              auVar94._0_4_ = iVar72;
              auVar94._8_4_ = iVar71;
              auVar94._12_4_ = iVar71;
              auVar49._4_4_ = -(uint)(auVar48._4_4_ == iVar96);
              auVar49._12_4_ = -(uint)(auVar48._12_4_ == iVar83);
              auVar49._0_4_ = auVar49._4_4_;
              auVar49._8_4_ = auVar49._12_4_;
              auVar77._0_4_ = auVar77._4_4_;
              auVar77._8_4_ = auVar77._12_4_;
              auVar77 = auVar77 | auVar49 & auVar94;
              local_1c8 = local_1c8 & auVar77 | ~auVar77 & auVar111;
              auVar48 = local_218 ^ _DAT_00904920;
              iVar72 = -(uint)(auVar61._0_4_ < auVar48._0_4_);
              iVar71 = -(uint)(iVar96 < auVar48._4_4_);
              iVar82 = -(uint)(auVar61._8_4_ < auVar48._8_4_);
              iVar84 = -(uint)(iVar83 < auVar48._12_4_);
              auVar95._4_4_ = iVar72;
              auVar95._0_4_ = iVar72;
              auVar95._8_4_ = iVar82;
              auVar95._12_4_ = iVar82;
              auVar50._4_4_ = -(uint)(auVar48._4_4_ == iVar96);
              auVar50._12_4_ = -(uint)(auVar48._12_4_ == iVar83);
              auVar50._0_4_ = auVar50._4_4_;
              auVar50._8_4_ = auVar50._12_4_;
              auVar62._4_4_ = iVar71;
              auVar62._0_4_ = iVar71;
              auVar62._8_4_ = iVar84;
              auVar62._12_4_ = iVar84;
              auVar62 = auVar62 | auVar50 & auVar95;
              auVar61 = ~auVar62 & auVar111 | local_218 & auVar62;
              auVar48 = auVar61 ^ _DAT_00904920;
              auVar115 = local_178 ^ _DAT_00904920;
              iVar72 = -(uint)(auVar115._0_4_ < auVar48._0_4_);
              iVar71 = -(uint)(auVar115._4_4_ < auVar48._4_4_);
              iVar96 = -(uint)(auVar115._8_4_ < auVar48._8_4_);
              iVar82 = -(uint)(auVar115._12_4_ < auVar48._12_4_);
              auVar99._4_4_ = iVar72;
              auVar99._0_4_ = iVar72;
              auVar99._8_4_ = iVar96;
              auVar99._12_4_ = iVar96;
              iVar72 = -(uint)(auVar115._4_4_ == auVar48._4_4_);
              iVar96 = -(uint)(auVar115._12_4_ == auVar48._12_4_);
              auVar51._4_4_ = iVar72;
              auVar51._0_4_ = iVar72;
              auVar51._8_4_ = iVar96;
              auVar51._12_4_ = iVar96;
              auVar78._4_4_ = iVar71;
              auVar78._0_4_ = iVar71;
              auVar78._8_4_ = iVar82;
              auVar78._12_4_ = iVar82;
              auVar78 = auVar78 | auVar51 & auVar99;
              auVar115 = ~auVar78 & local_178 | auVar61 & auVar78;
              auVar48 = auVar115 ^ _DAT_00904920;
              auVar61 = auVar73 ^ _DAT_00904920;
              iVar72 = -(uint)(auVar61._0_4_ < auVar48._0_4_);
              iVar71 = -(uint)(auVar61._4_4_ < auVar48._4_4_);
              iVar96 = -(uint)(auVar61._8_4_ < auVar48._8_4_);
              iVar82 = -(uint)(auVar61._12_4_ < auVar48._12_4_);
              auVar100._4_4_ = iVar72;
              auVar100._0_4_ = iVar72;
              auVar100._8_4_ = iVar96;
              auVar100._12_4_ = iVar96;
              iVar72 = -(uint)(auVar61._4_4_ == auVar48._4_4_);
              iVar96 = -(uint)(auVar61._12_4_ == auVar48._12_4_);
              auVar52._4_4_ = iVar72;
              auVar52._0_4_ = iVar72;
              auVar52._8_4_ = iVar96;
              auVar52._12_4_ = iVar96;
              auVar63._4_4_ = iVar71;
              auVar63._0_4_ = iVar71;
              auVar63._8_4_ = iVar82;
              auVar63._12_4_ = iVar82;
              auVar63 = auVar63 | auVar52 & auVar100;
              auVar61 = ~auVar63 & auVar73 | auVar115 & auVar63;
              auVar48 = auVar61 ^ _DAT_00904920;
              auVar115 = auVar123 ^ _DAT_00904920;
              iVar72 = -(uint)(auVar115._0_4_ < auVar48._0_4_);
              iVar71 = -(uint)(auVar115._4_4_ < auVar48._4_4_);
              iVar96 = -(uint)(auVar115._8_4_ < auVar48._8_4_);
              iVar82 = -(uint)(auVar115._12_4_ < auVar48._12_4_);
              auVar101._4_4_ = iVar72;
              auVar101._0_4_ = iVar72;
              auVar101._8_4_ = iVar96;
              auVar101._12_4_ = iVar96;
              iVar72 = -(uint)(auVar115._4_4_ == auVar48._4_4_);
              iVar96 = -(uint)(auVar115._12_4_ == auVar48._12_4_);
              auVar53._4_4_ = iVar72;
              auVar53._0_4_ = iVar72;
              auVar53._8_4_ = iVar96;
              auVar53._12_4_ = iVar96;
              auVar79._4_4_ = iVar71;
              auVar79._0_4_ = iVar71;
              auVar79._8_4_ = iVar82;
              auVar79._12_4_ = iVar82;
              auVar79 = auVar79 | auVar53 & auVar101;
              local_218 = ~auVar79 & auVar123 | auVar61 & auVar79;
            }
            bVar36 = uVar25 == local_2e0;
            plVar5 = (long *)((ppVar15->field_4).trace)->trace_del_table;
            lVar31 = *plVar5;
            lVar57 = plVar5[4];
            bVar35 = uVar23 < uVar17;
            if (bVar35 && bVar36) {
              *(int *)(lVar31 + uVar23 * 4) = auVar111._8_4_;
            }
            if (uVar18 == uVar23) {
              *(int *)(lVar57 + uVar25 * 4) = auVar111._8_4_;
            }
            bVar37 = uVar22 == local_2e0;
            bVar38 = uVar23 != 0;
            if (bVar38 && bVar37) {
              *(int *)(lVar31 + -4 + uVar23 * 4) = auVar111._0_4_;
            }
            bVar7 = (long)uVar22 < lVar29;
            bVar39 = uVar17 == uVar23;
            if (bVar39 && bVar7) {
              *(int *)(lVar57 + uVar22 * 4) = auVar111._0_4_;
            }
            pvVar6 = ((ppVar15->field_4).trace)->trace_del_table;
            lVar31 = *(long *)((long)pvVar6 + 8);
            lVar57 = *(long *)((long)pvVar6 + 0x28);
            if (bVar35 && bVar36) {
              *(int *)(lVar31 + uVar23 * 4) = local_178._8_4_;
            }
            if (uVar18 == uVar23) {
              *(int *)(lVar57 + uVar25 * 4) = local_178._8_4_;
            }
            if (bVar38 && bVar37) {
              *(int *)(lVar31 + -4 + uVar23 * 4) = local_178._0_4_;
            }
            if (bVar39 && bVar7) {
              *(int *)(lVar57 + uVar22 * 4) = local_178._0_4_;
            }
            pvVar6 = ((ppVar15->field_4).trace)->trace_del_table;
            lVar31 = *(long *)((long)pvVar6 + 0x10);
            lVar57 = *(long *)((long)pvVar6 + 0x30);
            if (bVar35 && bVar36) {
              *(int *)(lVar31 + uVar23 * 4) = auVar73._8_4_;
            }
            if (uVar18 == uVar23) {
              *(int *)(lVar57 + uVar25 * 4) = auVar73._8_4_;
            }
            if (bVar38 && bVar37) {
              *(int *)(lVar31 + -4 + uVar23 * 4) = auVar73._0_4_;
            }
            if (bVar39 && bVar7) {
              *(int *)(lVar57 + uVar22 * 4) = auVar73._0_4_;
            }
            pvVar6 = ((ppVar15->field_4).trace)->trace_del_table;
            lVar31 = *(long *)((long)pvVar6 + 0x18);
            lVar57 = *(long *)((long)pvVar6 + 0x38);
            if (bVar35 && bVar36) {
              *(int *)(lVar31 + uVar23 * 4) = auVar123._8_4_;
            }
            if (uVar18 == uVar23) {
              *(int *)(lVar57 + uVar25 * 4) = auVar123._8_4_;
            }
            if (bVar38 && bVar37) {
              *(int *)(lVar31 + -4 + uVar23 * 4) = auVar123._0_4_;
            }
            if (bVar39 && bVar7) {
              *(int *)(lVar57 + uVar22 * 4) = auVar123._0_4_;
            }
            auVar61._8_8_ = uVar4;
            auVar61._0_8_ = lVar104;
            auVar48 = auVar91 & auVar42 | ~auVar42 & auVar86;
            auVar121 = ~auVar42 & auVar121;
            local_1f8 = ~auVar42 & local_1f8;
            auVar43 = ~auVar42 & auVar43;
            auVar54._8_8_ = -(ulong)(lStack_160 == uVar17 - 1);
            auVar54._0_8_ = -(ulong)(local_168 == uVar17 - 1);
            auVar13._4_4_ = iVar67;
            auVar13._0_4_ = iVar56;
            auVar13._8_4_ = iVar68;
            auVar13._12_4_ = iVar70;
            auVar64._4_4_ = iVar56;
            auVar64._0_4_ = iVar67;
            auVar64._8_4_ = iVar70;
            auVar64._12_4_ = iVar68;
            auVar54 = auVar54 & auVar64 & auVar13;
            auVar122 = auVar111 & auVar54 | ~auVar54 & auVar122;
            auVar106 = local_178 & auVar54 | ~auVar54 & auVar106;
            auVar90 = auVar73 & auVar54 | ~auVar54 & auVar90;
            auVar40 = ~auVar54 & auVar40 | auVar123 & auVar54;
            ptr_01[uVar23] = auVar111._0_8_;
            ptr_02[uVar23] = local_178._0_8_;
            ptr_03[uVar23] = auVar73._0_8_;
            ptr_04[uVar23] = auVar123._0_8_;
            ptr_05[uVar23] = lVar34;
            local_278 = auVar105._0_8_;
            uStack_270 = auVar105._8_8_;
            ptr_06[uVar23] = local_278;
            local_288 = auVar109._0_8_;
            uStack_280 = auVar109._8_8_;
            ptr_07[uVar23] = local_288;
            ptr_08[uVar23] = auVar102._0_8_;
            local_168 = local_168 + 1;
            lStack_160 = lStack_160 + 1;
            uVar23 = uVar23 + 1;
            local_1e8 = auVar97;
          } while (s2Len + 1 != uVar23);
          local_f8 = auVar59._0_8_;
          lStack_f0 = auVar59._8_8_;
          auVar59._0_8_ = local_f8 + 2;
          auVar59._8_8_ = lStack_f0 + 2;
          uStack_110 = (ulong)(uint)(gap * 2);
          local_298 = local_298 - (ulong)(uint)(gap * 2);
          lStack_290 = lStack_290 - uStack_110;
          uVar25 = uVar1;
        } while ((long)uVar1 < lVar29);
      }
      uVar24 = uVar19;
      uVar17 = uVar19;
      uVar25 = uVar19;
      bVar35 = true;
      do {
        bVar36 = bVar35;
        if ((long)uVar17 < (long)auVar122._8_8_) {
          uVar24 = auVar106._8_8_;
          uVar19 = auVar90._8_8_;
          uVar25 = auVar40._8_8_;
          uVar17 = auVar122._8_8_;
        }
        iVar67 = (int)uVar25;
        iVar33 = (int)uVar19;
        iVar56 = (int)uVar24;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = auVar122._0_8_;
        auVar122 = auVar8 << 0x40;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = auVar106._0_8_;
        auVar106 = auVar9 << 0x40;
        auVar10._8_8_ = 0;
        auVar10._0_8_ = auVar90._0_8_;
        auVar90 = auVar10 << 0x40;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = auVar40._0_8_;
        auVar40 = auVar11 << 0x40;
        bVar35 = false;
      } while (bVar36);
      local_260 = (uint)uVar27;
      iStack_25c = (int)(uVar27 >> 0x20);
      iVar68 = -(uint)((int)(local_260 ^ 0x80000000) < (int)(local_1c8._0_4_ ^ 0x80000000));
      auVar65._4_4_ = -(uint)(iStack_25c < (int)local_1c8._4_4_);
      iVar70 = -(uint)((int)(local_260 ^ 0x80000000) < (int)(local_1c8._8_4_ ^ 0x80000000));
      auVar65._12_4_ = -(uint)(iStack_25c < (int)local_1c8._12_4_);
      auVar80._4_4_ = iVar68;
      auVar80._0_4_ = iVar68;
      auVar80._8_4_ = iVar70;
      auVar80._12_4_ = iVar70;
      auVar44._4_4_ = -(uint)(iStack_25c == local_1c8._4_4_);
      auVar44._12_4_ = -(uint)(iStack_25c == local_1c8._12_4_);
      auVar44._0_4_ = auVar44._4_4_;
      auVar44._8_4_ = auVar44._12_4_;
      auVar65._0_4_ = auVar65._4_4_;
      auVar65._8_4_ = auVar65._12_4_;
      auVar45._8_4_ = 0xffffffff;
      auVar45._0_8_ = 0xffffffffffffffff;
      auVar45._12_4_ = 0xffffffff;
      iVar68 = -(uint)((int)(uVar85 ^ 0x80000000) < (int)(local_218._0_4_ ^ 0x80000000));
      auVar55._4_4_ = -(uint)(iVar89 < (int)local_218._4_4_);
      iVar70 = -(uint)((int)(uVar85 ^ 0x80000000) < (int)(local_218._8_4_ ^ 0x80000000));
      auVar55._12_4_ = -(uint)(iVar89 < (int)local_218._12_4_);
      auVar81._4_4_ = iVar68;
      auVar81._0_4_ = iVar68;
      auVar81._8_4_ = iVar70;
      auVar81._12_4_ = iVar70;
      auVar66._4_4_ = -(uint)(iVar89 == local_218._4_4_);
      auVar66._12_4_ = -(uint)(iVar89 == local_218._12_4_);
      auVar66._0_4_ = auVar66._4_4_;
      auVar66._8_4_ = auVar66._12_4_;
      auVar55._0_4_ = auVar55._4_4_;
      auVar55._8_4_ = auVar55._12_4_;
      auVar40 = auVar55 | auVar66 & auVar81 | auVar45 ^ (auVar65 | auVar44 & auVar80);
      if ((((((((((((((((auVar40 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar40 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar40 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar40 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar40 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar40 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar40 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar40 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar40 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar40 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar40 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar40 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar40 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar40 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar40 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar40[0xf] < '\0'
         ) {
        *(byte *)&ppVar15->flag = (byte)ppVar15->flag | 0x40;
        local_2e0 = 0;
        local_30c = 0;
        uVar17 = 0;
        iVar56 = 0;
        iVar33 = 0;
        iVar67 = 0;
      }
      ppVar15->score = (int)uVar17;
      ppVar15->end_query = local_2e0;
      ppVar15->end_ref = local_30c;
      ((ppVar15->field_4).stats)->matches = iVar56;
      ((ppVar15->field_4).stats)->similar = iVar33;
      ((ppVar15->field_4).stats)->length = iVar67;
      parasail_free(ptr_08);
      parasail_free(ptr_07);
      parasail_free(ptr_06);
      parasail_free(ptr_05);
      parasail_free(ptr_04);
      parasail_free(ptr_03);
      parasail_free(ptr_02);
      parasail_free(ptr_01);
      parasail_free(ptr_00);
      parasail_free(ptr);
      return ppVar15;
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int64_t * restrict s1 = NULL;
    int64_t * restrict s2B = NULL;
    int64_t * restrict _H_pr = NULL;
    int64_t * restrict _HM_pr = NULL;
    int64_t * restrict _HS_pr = NULL;
    int64_t * restrict _HL_pr = NULL;
    int64_t * restrict _F_pr = NULL;
    int64_t * restrict _FM_pr = NULL;
    int64_t * restrict _FS_pr = NULL;
    int64_t * restrict _FL_pr = NULL;
    int64_t * restrict s2 = NULL;
    int64_t * restrict H_pr = NULL;
    int64_t * restrict HM_pr = NULL;
    int64_t * restrict HS_pr = NULL;
    int64_t * restrict HL_pr = NULL;
    int64_t * restrict F_pr = NULL;
    int64_t * restrict FM_pr = NULL;
    int64_t * restrict FS_pr = NULL;
    int64_t * restrict FL_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vZero;
    __m128i vNegInf0;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxH;
    __m128i vMaxM;
    __m128i vMaxS;
    __m128i vMaxL;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 2; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    matches = NEG_LIMIT;
    similar = NEG_LIMIT;
    length = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vOpen = _mm_set1_epi64x_rpl(open);
    vGap  = _mm_set1_epi64x_rpl(gap);
    vZero = _mm_set1_epi64x_rpl(0);
    vNegInf0 = _mm_insert_epi64_rpl(vZero, NEG_LIMIT, 1);
    vOne = _mm_set1_epi64x_rpl(1);
    vN = _mm_set1_epi64x_rpl(N);
    vGapN = _mm_set1_epi64x_rpl(gap*N);
    vNegOne = _mm_set1_epi64x_rpl(-1);
    vI = _mm_set_epi64x_rpl(0,1);
    vJreset = _mm_set_epi64x_rpl(0,-1);
    vMaxH = vNegInf;
    vMaxM = vNegInf;
    vMaxS = vNegInf;
    vMaxL = vNegInf;
    vILimit = _mm_set1_epi64x_rpl(s1Len);
    vILimit1 = _mm_sub_epi64(vILimit, vOne);
    vJLimit = _mm_set1_epi64x_rpl(s2Len);
    vJLimit1 = _mm_sub_epi64(vJLimit, vOne);
    vIBoundary = _mm_set_epi64x_rpl(
            -open-0*gap,
            -open-1*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1     = parasail_memalign_int64_t(16, s1Len+PAD);
    s2B    = parasail_memalign_int64_t(16, s2Len+PAD2);
    _H_pr  = parasail_memalign_int64_t(16, s2Len+PAD2);
    _HM_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _HS_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _HL_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _F_pr  = parasail_memalign_int64_t(16, s2Len+PAD2);
    _FM_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _FS_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _FL_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    HM_pr = _HM_pr+PAD;
    HS_pr = _HS_pr+PAD;
    HL_pr = _HL_pr+PAD;
    F_pr = _F_pr+PAD;
    FM_pr = _FM_pr+PAD;
    FS_pr = _FS_pr+PAD;
    FL_pr = _FL_pr+PAD;

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_HM_pr) return NULL;
    if (!_HS_pr) return NULL;
    if (!_HL_pr) return NULL;
    if (!_F_pr) return NULL;
    if (!_FM_pr) return NULL;
    if (!_FS_pr) return NULL;
    if (!_FL_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    /* pad back of s1 with dummy values */
    for (i=s1Len; i<s1Len_PAD; ++i) {
        s1[i] = 0; /* point to first matrix row because we don't care */
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = -open - j*gap;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = 0;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = 0;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i case1 = vZero;
        __m128i case2 = vZero;
        __m128i vNH = vZero;
        __m128i vNM = vZero;
        __m128i vNS = vZero;
        __m128i vNL = vZero;
        __m128i vWH = vZero;
        __m128i vWM = vZero;
        __m128i vWS = vZero;
        __m128i vWL = vZero;
        __m128i vE = vNegInf0;
        __m128i vE_opn = vNegInf;
        __m128i vE_ext = vNegInf;
        __m128i vEM = vZero;
        __m128i vES = vZero;
        __m128i vEL = vZero;
        __m128i vF = vNegInf0;
        __m128i vF_opn = vNegInf;
        __m128i vF_ext = vNegInf;
        __m128i vFM = vZero;
        __m128i vFS = vZero;
        __m128i vFL = vZero;
        __m128i vJ = vJreset;
        __m128i vs1 = _mm_set_epi64x_rpl(
                s1[i+0],
                s1[i+1]);
        __m128i vs2 = vNegInf;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        vNH = _mm_insert_epi64_rpl(vNH, H_pr[-1], 1);
        vWH = _mm_insert_epi64_rpl(vWH, -open - i*gap, 1);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            __m128i vNWM = vNM;
            __m128i vNWS = vNS;
            __m128i vNWL = vNL;
            vNH = _mm_srli_si128(vWH, 8);
            vNH = _mm_insert_epi64_rpl(vNH, H_pr[j], 1);
            vNM = _mm_srli_si128(vWM, 8);
            vNM = _mm_insert_epi64_rpl(vNM, HM_pr[j], 1);
            vNS = _mm_srli_si128(vWS, 8);
            vNS = _mm_insert_epi64_rpl(vNS, HS_pr[j], 1);
            vNL = _mm_srli_si128(vWL, 8);
            vNL = _mm_insert_epi64_rpl(vNL, HL_pr[j], 1);
            vF = _mm_srli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, F_pr[j], 1);
            vFM = _mm_srli_si128(vFM, 8);
            vFM = _mm_insert_epi64_rpl(vFM, FM_pr[j], 1);
            vFS = _mm_srli_si128(vFS, 8);
            vFS = _mm_insert_epi64_rpl(vFS, FS_pr[j], 1);
            vFL = _mm_srli_si128(vFL, 8);
            vFL = _mm_insert_epi64_rpl(vFL, FL_pr[j], 1);
            vF_opn = _mm_sub_epi64(vNH, vOpen);
            vF_ext = _mm_sub_epi64(vF, vGap);
            vF = _mm_max_epi64_rpl(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi64_rpl(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8_rpl(vFM, vNM, case1);
            vFS = _mm_blendv_epi8_rpl(vFS, vNS, case1);
            vFL = _mm_blendv_epi8_rpl(vFL, vNL, case1);
            vFL = _mm_add_epi64(vFL, vOne);
            vE_opn = _mm_sub_epi64(vWH, vOpen);
            vE_ext = _mm_sub_epi64(vE, vGap);
            vE = _mm_max_epi64_rpl(vE_opn, vE_ext);
            case1 = _mm_cmpgt_epi64_rpl(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8_rpl(vEM, vWM, case1);
            vES = _mm_blendv_epi8_rpl(vES, vWS, case1);
            vEL = _mm_blendv_epi8_rpl(vEL, vWL, case1);
            vEL = _mm_add_epi64(vEL, vOne);
            vs2 = _mm_srli_si128(vs2, 8);
            vs2 = _mm_insert_epi64_rpl(vs2, s2[j], 1);
            vMat = _mm_set_epi64x_rpl(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]]
                    );
            vNWH = _mm_add_epi64(vNWH, vMat);
            vWH = _mm_max_epi64_rpl(vNWH, vE);
            vWH = _mm_max_epi64_rpl(vWH, vF);
            case1 = _mm_cmpeq_epi64_rpl(vWH, vNWH);
            case2 = _mm_cmpeq_epi64_rpl(vWH, vF);
            vWM = _mm_blendv_epi8_rpl(
                    _mm_blendv_epi8_rpl(vEM, vFM, case2),
                    _mm_add_epi64(vNWM,
                        _mm_and_si128(
                            _mm_cmpeq_epi64_rpl(vs1,vs2),
                            vOne)),
                    case1);
            vWS = _mm_blendv_epi8_rpl(
                    _mm_blendv_epi8_rpl(vES, vFS, case2),
                    _mm_add_epi64(vNWS,
                        _mm_and_si128(
                            _mm_cmpgt_epi64_rpl(vMat,vZero),
                            vOne)),
                    case1);
            vWL = _mm_blendv_epi8_rpl(
                    _mm_blendv_epi8_rpl(vEL, vFL, case2),
                    _mm_add_epi64(vNWL, vOne), case1);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi64_rpl(vJ,vNegOne);
                vWH = _mm_blendv_epi8_rpl(vWH, vIBoundary, cond);
                vWM = _mm_andnot_si128(cond, vWM);
                vWS = _mm_andnot_si128(cond, vWS);
                vWL = _mm_andnot_si128(cond, vWL);
                vE = _mm_blendv_epi8_rpl(vE, vNegInf, cond);
                vEM = _mm_andnot_si128(cond, vEM);
                vES = _mm_andnot_si128(cond, vES);
                vEL = _mm_andnot_si128(cond, vEL);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWM);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWS);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWL);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWL);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vWH, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vWM, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vWS, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vWL, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->stats->rowcols->score_row,   result->stats->rowcols->score_col, vWH, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->matches_row, result->stats->rowcols->matches_col, vWM, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->similar_row, result->stats->rowcols->similar_col, vWS, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->length_row,  result->stats->rowcols->length_col, vWL, i, s1Len, j, s2Len);
#endif
            H_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWH,0);
            HM_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWM,0);
            HS_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWS,0);
            HL_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWL,0);
            F_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vF,0);
            FM_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vFM,0);
            FS_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vFS,0);
            FL_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vFL,0);
            /* as minor diagonal vector passes across table, extract
               last table value at the i,j bound */
            {
                __m128i cond_valid_I = _mm_cmpeq_epi64_rpl(vI, vILimit1);
                __m128i cond_valid_J = _mm_cmpeq_epi64_rpl(vJ, vJLimit1);
                __m128i cond_all = _mm_and_si128(cond_valid_I, cond_valid_J);
                vMaxH = _mm_blendv_epi8_rpl(vMaxH, vWH, cond_all);
                vMaxM = _mm_blendv_epi8_rpl(vMaxM, vWM, cond_all);
                vMaxS = _mm_blendv_epi8_rpl(vMaxS, vWS, cond_all);
                vMaxL = _mm_blendv_epi8_rpl(vMaxL, vWL, cond_all);
            }
            vJ = _mm_add_epi64(vJ, vOne);
        }
        vI = _mm_add_epi64(vI, vN);
        vIBoundary = _mm_sub_epi64(vIBoundary, vGapN);
    }

    /* max in vMaxH */
    for (i=0; i<N; ++i) {
        int64_t value;
        value = (int64_t) _mm_extract_epi64_rpl(vMaxH, 1);
        if (value > score) {
            score = value;
            matches = (int64_t) _mm_extract_epi64_rpl(vMaxM, 1);
            similar = (int64_t) _mm_extract_epi64_rpl(vMaxS, 1);
            length= (int64_t) _mm_extract_epi64_rpl(vMaxL, 1);
        }
        vMaxH = _mm_slli_si128(vMaxH, 8);
        vMaxM = _mm_slli_si128(vMaxM, 8);
        vMaxS = _mm_slli_si128(vMaxS, 8);
        vMaxL = _mm_slli_si128(vMaxL, 8);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(_FL_pr);
    parasail_free(_FS_pr);
    parasail_free(_FM_pr);
    parasail_free(_F_pr);
    parasail_free(_HL_pr);
    parasail_free(_HS_pr);
    parasail_free(_HM_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    parasail_free(s1);

    return result;
}